

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooled_alloc.c
# Opt level: O0

pool_alloc_t * pool_create(size_t dsize)

{
  pool_alloc_t *p;
  size_t dsize_local;
  
  dsize_local = (size_t)malloc(0x20);
  if ((undefined8 *)dsize_local == (undefined8 *)0x0) {
    dsize_local = 0;
  }
  else {
    p = (pool_alloc_t *)(dsize + 7 & 0xfffffffffffffff8);
    if (p < (pool_alloc_t *)0x8) {
      p = (pool_alloc_t *)0x8;
    }
    *(pool_alloc_t **)dsize_local = p;
    *(undefined8 *)(dsize_local + 8) = 0;
    *(undefined8 *)(dsize_local + 0x10) = 0;
    *(undefined8 *)(dsize_local + 0x18) = 0;
  }
  return (pool_alloc_t *)dsize_local;
}

Assistant:

pool_alloc_t *pool_create(size_t dsize) {
    pool_alloc_t *p;

    if (NULL == (p = (pool_alloc_t *)malloc(sizeof(*p))))
	return NULL;

    /* Minimum size is a pointer, for free list */
    dsize = (dsize + sizeof(void *) - 1) & ~(sizeof(void *)-1);
    if (dsize < sizeof(void *))
	dsize = sizeof(void *);
    p->dsize = dsize;

    p->npools = 0;
    p->pools = NULL;
    p->free  = NULL;

    return p;
}